

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int uv_write2(uv_write_t *req,uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle
             ,uv_write_cb cb)

{
  void **ppvVar1;
  uv_handle_type uVar2;
  size_t sVar3;
  long *plVar4;
  int iVar5;
  uv_buf_t *__dest;
  size_t sVar6;
  
  if (nbufs == 0) {
    __assert_fail("nbufs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x570,
                  "int uv_write2(uv_write_t *, uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *, uv_write_cb)"
                 );
  }
  uVar2 = stream->type;
  if ((UV_TTY < uVar2) || ((0x5080U >> (uVar2 & (UV_SIGNAL|UV_UDP)) & 1) == 0)) {
    __assert_fail("(stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY) && \"uv_write (unix) does not yet support other types of streams\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x574,
                  "int uv_write2(uv_write_t *, uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *, uv_write_cb)"
                 );
  }
  if ((stream->io_watcher).fd < 0) {
    return -9;
  }
  if (send_handle != (uv_stream_t *)0x0) {
    if (uVar2 != UV_NAMED_PIPE) {
      return -0x16;
    }
    if (*(int *)&stream[1].data == 0) {
      return -0x16;
    }
    iVar5 = uv__handle_fd((uv_handle_t *)send_handle);
    if (iVar5 < 0) {
      return -9;
    }
  }
  sVar3 = stream->write_queue_size;
  req->type = UV_WRITE;
  req->active_queue[0] = stream->loop->active_reqs;
  plVar4 = (long *)stream->loop->active_reqs[1];
  req->active_queue[1] = plVar4;
  *plVar4 = (long)req->active_queue;
  stream->loop->active_reqs[1] = req->active_queue;
  req->cb = cb;
  req->handle = stream;
  req->error = 0;
  req->send_handle = send_handle;
  ppvVar1 = req->queue;
  req->queue[0] = ppvVar1;
  req->queue[1] = ppvVar1;
  __dest = req->bufsml;
  req->bufs = __dest;
  if (4 < nbufs) {
    __dest = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
    req->bufs = __dest;
    if (__dest == (uv_buf_t *)0x0) {
      return -0xc;
    }
  }
  memcpy(__dest,bufs,(ulong)nbufs << 4);
  req->nbufs = nbufs;
  req->write_index = 0;
  sVar6 = uv__count_bufs(bufs,nbufs);
  stream->write_queue_size = stream->write_queue_size + sVar6;
  req->queue[0] = stream->write_queue;
  plVar4 = (long *)stream->write_queue[1];
  req->queue[1] = plVar4;
  *plVar4 = (long)ppvVar1;
  stream->write_queue[1] = ppvVar1;
  if (stream->connect_req == (uv_connect_t *)0x0) {
    if (sVar3 == 0) {
      uv__write(stream);
    }
    else {
      if ((stream->flags & 0x80) != 0) {
        __assert_fail("!(stream->flags & UV_STREAM_BLOCKING)",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x5bc,
                      "int uv_write2(uv_write_t *, uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *, uv_write_cb)"
                     );
      }
      uv__io_start(stream->loop,&stream->io_watcher,4);
    }
  }
  return 0;
}

Assistant:

int uv_write2(uv_write_t* req,
              uv_stream_t* stream,
              const uv_buf_t bufs[],
              unsigned int nbufs,
              uv_stream_t* send_handle,
              uv_write_cb cb) {
  int empty_queue;

  assert(nbufs > 0);
  assert((stream->type == UV_TCP ||
          stream->type == UV_NAMED_PIPE ||
          stream->type == UV_TTY) &&
         "uv_write (unix) does not yet support other types of streams");

  if (uv__stream_fd(stream) < 0)
    return -EBADF;

  if (send_handle) {
    if (stream->type != UV_NAMED_PIPE || !((uv_pipe_t*)stream)->ipc)
      return -EINVAL;

    /* XXX We abuse uv_write2() to send over UDP handles to child processes.
     * Don't call uv__stream_fd() on those handles, it's a macro that on OS X
     * evaluates to a function that operates on a uv_stream_t with a couple of
     * OS X specific fields. On other Unices it does (handle)->io_watcher.fd,
     * which works but only by accident.
     */
    if (uv__handle_fd((uv_handle_t*) send_handle) < 0)
      return -EBADF;

#if defined(__CYGWIN__) || defined(__MSYS__)
    /* Cygwin recvmsg always sets msg_controllen to zero, so we cannot send it.
       See https://github.com/mirror/newlib-cygwin/blob/86fc4bf0/winsup/cygwin/fhandler_socket.cc#L1736-L1743 */
    return -ENOSYS;
#endif
  }

  /* It's legal for write_queue_size > 0 even when the write_queue is empty;
   * it means there are error-state requests in the write_completed_queue that
   * will touch up write_queue_size later, see also uv__write_req_finish().
   * We could check that write_queue is empty instead but that implies making
   * a write() syscall when we know that the handle is in error mode.
   */
  empty_queue = (stream->write_queue_size == 0);

  /* Initialize the req */
  uv__req_init(stream->loop, req, UV_WRITE);
  req->cb = cb;
  req->handle = stream;
  req->error = 0;
  req->send_handle = send_handle;
  QUEUE_INIT(&req->queue);

  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(bufs[0]));

  if (req->bufs == NULL)
    return -ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(bufs[0]));
  req->nbufs = nbufs;
  req->write_index = 0;
  stream->write_queue_size += uv__count_bufs(bufs, nbufs);

  /* Append the request to write_queue. */
  QUEUE_INSERT_TAIL(&stream->write_queue, &req->queue);

  /* If the queue was empty when this function began, we should attempt to
   * do the write immediately. Otherwise start the write_watcher and wait
   * for the fd to become writable.
   */
  if (stream->connect_req) {
    /* Still connecting, do nothing. */
  }
  else if (empty_queue) {
    uv__write(stream);
  }
  else {
    /*
     * blocking streams should never have anything in the queue.
     * if this assert fires then somehow the blocking stream isn't being
     * sufficiently flushed in uv__write.
     */
    assert(!(stream->flags & UV_STREAM_BLOCKING));
    uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);
    uv__stream_osx_interrupt_select(stream);
  }

  return 0;
}